

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathMLASTArithmeticExpression.cpp
# Opt level: O2

int __thiscall
MathML::AST::ArithmeticExpression::clone
          (ArithmeticExpression *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  int iVar1;
  undefined8 *puVar2;
  const_reference ppIVar3;
  undefined4 extraout_var;
  size_t i;
  ulong __n;
  INode *local_38;
  
  puVar2 = (undefined8 *)operator_new(0x28);
  *puVar2 = &PTR__ArithmeticExpression_00a05cc8;
  puVar2[1] = 0;
  puVar2[2] = 0;
  puVar2[3] = 0;
  *(Operator *)(puVar2 + 4) = this->mOperator;
  for (__n = 0; __n < (ulong)((long)(this->mOperands).
                                    super__Vector_base<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->mOperands).
                                    super__Vector_base<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3); __n = __n + 1)
  {
    ppIVar3 = std::vector<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>::at
                        (&this->mOperands,__n);
    iVar1 = (*(*ppIVar3)->_vptr_INode[4])(*ppIVar3,(ulong)__fn & 0xffffffff);
    local_38 = (INode *)CONCAT44(extraout_var,iVar1);
    std::vector<MathML::AST::INode*,std::allocator<MathML::AST::INode*>>::
    emplace_back<MathML::AST::INode*>
              ((vector<MathML::AST::INode*,std::allocator<MathML::AST::INode*>> *)(puVar2 + 1),
               &local_38);
  }
  return (int)puVar2;
}

Assistant:

INode* ArithmeticExpression::clone(CloneFlags cloneFlags) const
        {
            ArithmeticExpression* copy = new ArithmeticExpression();
            copy->mOperator = mOperator;
            for (size_t i=0; i<mOperands.size(); ++i)
            {
                copy->mOperands.push_back( mOperands.at( i )->clone(cloneFlags) );
            }
            return copy;
        }